

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase847::~TestCase847(TestCase847 *this)

{
  TestCase847 *this_local;
  
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Async, ArrayJoinException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromises(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are not completed early.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // Rejected tasks do not fail-fast.
    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // The final fulfillment makes the promise ready.
    fulfillers[i++]->fulfill();
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == 4);
  }
}